

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O1

string * __thiscall Poisson::getParameter(string *__return_storage_ptr__,Poisson *this,string *name)

{
  int iVar1;
  stringstream parameter;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    std::ostream::_M_insert<double>
              (this->poissonRate /
               ((this->super_StochasticEventGenerator).super_StochasticVariable.
                super_StochasticProcess.super_TimeDependent.xTime)->dt);
  }
  else {
    Parametric::getParameter(&local_1c0,(Parametric *)this,name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string Poisson::getParameter(const string& name) const
{
	stringstream parameter;
	if (name=="rate")
		parameter << poissonRate/xTime->dt;
	else
		parameter << StochasticEventGenerator::getParameter( name );
	
	return parameter.str();

}